

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_lpf_uninit(ma_lpf *pLPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_lpf1 *in_RSI;
  long in_RDI;
  ma_uint32 ilpf2;
  ma_uint32 ilpf1;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar1;
  uint uVar2;
  
  if (in_RDI != 0) {
    for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 0xc); uVar2 = uVar2 + 1) {
      ma_lpf1_uninit(in_RSI,(ma_allocation_callbacks *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
    }
    for (uVar1 = 0; uVar1 < *(uint *)(in_RDI + 0x10); uVar1 = uVar1 + 1) {
      ma_lpf2_uninit((ma_lpf2 *)in_RSI,(ma_allocation_callbacks *)CONCAT44(uVar2,uVar1));
    }
    if (*(int *)(in_RDI + 0x30) != 0) {
      ma_free(in_RSI,(ma_allocation_callbacks *)CONCAT44(uVar2,uVar1));
    }
  }
  return;
}

Assistant:

MA_API void ma_lpf_uninit(ma_lpf* pLPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;

    if (pLPF == NULL) {
        return;
    }

    for (ilpf1 = 0; ilpf1 < pLPF->lpf1Count; ilpf1 += 1) {
        ma_lpf1_uninit(&pLPF->pLPF1[ilpf1], pAllocationCallbacks);
    }

    for (ilpf2 = 0; ilpf2 < pLPF->lpf2Count; ilpf2 += 1) {
        ma_lpf2_uninit(&pLPF->pLPF2[ilpf2], pAllocationCallbacks);
    }

    if (pLPF->_ownsHeap) {
        ma_free(pLPF->_pHeap, pAllocationCallbacks);
    }
}